

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexReader::getPixel
          (PtexReader *this,int faceid,int u,int v,float *result,int firstchan,int nchannelsArg,
          Res res)

{
  DataType dt;
  _func_int *p_Var1;
  long lVar2;
  PtexPtr<Ptex::v2_2::PtexFaceData> dst;
  int iVar3;
  undefined4 extraout_var;
  void *src;
  int numChannels;
  undefined8 uStack_50;
  PtexPtr<Ptex::v2_2::PtexFaceData> local_48;
  PtexPtr<Ptex::v2_2::PtexFaceData> data;
  PtexFaceData *pPVar4;
  
  uStack_50 = 0x115035;
  data._ptr = (PtexFaceData *)result;
  memset(result,0,(long)nchannelsArg);
  numChannels = (uint)(this->_header).nchannels - firstchan;
  if (nchannelsArg < numChannels) {
    numChannels = nchannelsArg;
  }
  if (0 < numChannels) {
    uStack_50 = 0x115065;
    iVar3 = (*(this->super_PtexTexture)._vptr_PtexTexture[0x14])
                      (this,(ulong)(uint)faceid,(ulong)(ushort)res);
    pPVar4 = (PtexFaceData *)CONCAT44(extraout_var,iVar3);
    lVar2 = -((long)this->_pixelsize + 0xfU & 0xfffffffffffffff0);
    p_Var1 = pPVar4->_vptr_PtexFaceData[5];
    local_48._ptr = pPVar4;
    *(undefined8 *)((long)&uStack_50 + lVar2) = 0x115095;
    (*p_Var1)(pPVar4,(ulong)(uint)u,(ulong)(uint)v,(long)&local_48 + lVar2);
    dst = data;
    dt = (this->_header).datatype;
    iVar3 = *(int *)(DataSize(Ptex::v2_2::DataType)::sizes + (ulong)dt * 4);
    src = (void *)((long)&local_48 + lVar2 + (long)(firstchan * iVar3));
    if ((ulong)dt == 3) {
      *(undefined8 *)((long)&uStack_50 + lVar2) = 0x1150ca;
      memcpy(dst._ptr,src,(long)(iVar3 * numChannels));
    }
    else {
      *(undefined8 *)((long)&uStack_50 + lVar2) = 0x1150db;
      ConvertToFloat((float *)dst._ptr,src,dt,numChannels);
    }
    *(undefined8 *)((long)&uStack_50 + lVar2) = 0x1150e4;
    PtexPtr<Ptex::v2_2::PtexFaceData>::~PtexPtr(&local_48);
  }
  return;
}

Assistant:

void PtexReader::getPixel(int faceid, int u, int v,
                          float* result, int firstchan, int nchannelsArg,
                          Ptex::Res res)
{
    memset(result, 0, nchannelsArg);

    // clip nchannels against actual number available
    nchannelsArg = PtexUtils::min(nchannelsArg, _header.nchannels-firstchan);
    if (nchannelsArg <= 0) return;

    // get raw pixel data
    PtexPtr<PtexFaceData> data ( getData(faceid, res) );
    void* pixel = alloca(_pixelsize);
    data->getPixel(u, v, pixel);

    // adjust for firstchan offset
    int datasize = DataSize(datatype());
    if (firstchan)
        pixel = (char*) pixel + datasize * firstchan;

    // convert/copy to result as needed
    if (datatype() == dt_float)
        memcpy(result, pixel, datasize * nchannelsArg);
    else
        ConvertToFloat(result, pixel, datatype(), nchannelsArg);
}